

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_cfg_analysis.cpp
# Opt level: O0

void __thiscall
spvtools::opt::StructuredCFGAnalysis::StructuredCFGAnalysis
          (StructuredCFGAnalysis *this,IRContext *ctx)

{
  bool bVar1;
  FeatureManager *this_00;
  Module *this_01;
  reference func_00;
  value_type *func;
  iterator __end2;
  iterator __begin2;
  Module *__range2;
  IRContext *ctx_local;
  StructuredCFGAnalysis *this_local;
  
  this->context_ = ctx;
  std::
  unordered_map<unsigned_int,_spvtools::opt::StructuredCFGAnalysis::ConstructInfo,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::StructuredCFGAnalysis::ConstructInfo>_>_>
  ::unordered_map(&this->bb_to_construct_);
  utils::BitVector::BitVector(&this->merge_blocks_,0x400);
  this_00 = IRContext::get_feature_mgr(this->context_);
  bVar1 = FeatureManager::HasCapability(this_00,CapabilityShader);
  if (bVar1) {
    this_01 = IRContext::module(this->context_);
    join_0x00000010_0x00000000_ = Module::begin(this_01);
    _func = Module::end(this_01);
    while (bVar1 = UptrVectorIterator<spvtools::opt::Function,_false>::operator!=
                             ((UptrVectorIterator<spvtools::opt::Function,_false> *)
                              &__end2.iterator_,
                              (UptrVectorIterator<spvtools::opt::Function,_false> *)&func), bVar1) {
      func_00 = UptrVectorIterator<spvtools::opt::Function,_false>::operator*
                          ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end2.iterator_);
      AddBlocksInFunction(this,func_00);
      UptrVectorIterator<spvtools::opt::Function,_false>::operator++
                ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end2.iterator_);
    }
  }
  return;
}

Assistant:

StructuredCFGAnalysis::StructuredCFGAnalysis(IRContext* ctx) : context_(ctx) {
  // If this is not a shader, there are no merge instructions, and not
  // structured CFG to analyze.
  if (!context_->get_feature_mgr()->HasCapability(spv::Capability::Shader)) {
    return;
  }

  for (auto& func : *context_->module()) {
    AddBlocksInFunction(&func);
  }
}